

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O2

bool __thiscall
BCL::
HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
::find_atomic_impl_(HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
                    *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
                   int *val)

{
  __type _Var1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  HME entry;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
  local_78;
  ulong uStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&this->field_0x18,key);
  local_78.len = 0;
  local_78.ptr.rank = 0;
  local_78.ptr.ptr = 0;
  uStack_60 = (ulong)(uint)uStack_60;
  uVar3 = this->capacity_;
  uVar4 = 0;
  do {
    atomic_get_entry((HME *)&local_50,this,(uVar4 * uVar4 + sVar2) % uVar3);
    local_78.len = local_50.field_2._M_allocated_capacity;
    uStack_60 = local_50.field_2._8_8_;
    local_78.ptr.rank = (size_t)local_50._M_dataplus._M_p;
    local_78.ptr.ptr = local_50._M_string_length;
    if ((local_50.field_2._8_8_ & 0x200000000) != 0) {
      Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
      ::get(&local_50,&local_78);
      _Var1 = std::operator==(&local_50,key);
      std::__cxx11::string::~string((string *)&local_50);
      if (_Var1) {
        *val = (uint)uStack_60;
        return true;
      }
    }
    uVar4 = uVar4 + 1;
    uVar3 = this->capacity_;
  } while (uVar4 < uVar3);
  return false;
}

Assistant:

bool find_atomic_impl_(const Key &key, T &val) {
    size_t hash = hash_fn_(key);
    size_type probe = 0;
    bool success = false;
    HME entry;
    int status;
    do {
      size_type slot = (hash + get_probe(probe++)) % capacity();
      entry = atomic_get_entry(slot);
      status = entry.used;
      if (status & ready_flag) {
        success = (entry.get_key() == key);
      }
    } while (!success && !(status & free_flag) && probe < capacity());
    if (success) {
      val = entry.get_val();
      return true;
    } else {
      return false;
    }
  }